

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_utils.hpp
# Opt level: O2

uint64_t time_utils::cumulative_days_in_months_before(uint year,uint month)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int aiStack_48 [16];
  
  aiStack_48[1] = 0x1f;
  bVar1 = is_leap_year(year);
  aiStack_48[2] = bVar1 | 0x1c;
  aiStack_48[3] = 0x1f;
  aiStack_48[4] = 0x1e;
  aiStack_48[5] = 0x1f;
  aiStack_48[6] = 0x1e;
  aiStack_48[7] = 0x1f;
  aiStack_48[8] = 0x1f;
  aiStack_48[9] = 0x1e;
  aiStack_48[10] = 0x1f;
  aiStack_48[0xb] = 0x1e;
  aiStack_48[0xc] = 0x1f;
  iVar2 = 0;
  for (uVar3 = 1; uVar3 < month; uVar3 = uVar3 + 1) {
    iVar2 = iVar2 + aiStack_48[uVar3];
  }
  return (long)iVar2;
}

Assistant:

static inline
uint64_t cumulative_days_in_months_before(unsigned year, unsigned month)
{
    const int days_in_month[] = {
        0,
        31,
        is_leap_year(year) ? 29 : 28,
        31,
        30,
        31,
        30,
        31,
        31,
        30,
        31,
        30,
        31,
    };
    int r = 0;
    for (unsigned m = 1; m < month; ++m)
        r += days_in_month[m];
    return r;
}